

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

btBroadphasePair * __thiscall
btSortedOverlappingPairCache::addOverlappingPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  long *plVar1;
  bool bVar2;
  btBroadphasePair *ptr;
  btBroadphaseProxy *in_RDX;
  btBroadphaseProxy *in_RSI;
  btBroadphaseProxy *in_RDI;
  btBroadphasePair *pair;
  void *mem;
  btAlignedObjectArray<btBroadphasePair> *in_stack_ffffffffffffffb0;
  btBroadphaseProxy *in_stack_ffffffffffffffc0;
  btSortedOverlappingPairCache *in_stack_ffffffffffffffc8;
  btBroadphasePair *local_8;
  
  bVar2 = needsBroadphaseCollision(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI);
  if (bVar2) {
    ptr = btAlignedObjectArray<btBroadphasePair>::expandNonInitializing(in_stack_ffffffffffffffb0);
    local_8 = (btBroadphasePair *)btBroadphasePair::operator_new(0x20,ptr);
    btBroadphasePair::btBroadphasePair(local_8,in_RSI,in_RDX);
    gOverlappingPairs = gOverlappingPairs + 1;
    gAddedPairs = gAddedPairs + 1;
    if (*(long *)((in_RDI->m_aabbMax).m_floats + 3) != 0) {
      plVar1 = *(long **)((in_RDI->m_aabbMax).m_floats + 3);
      (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI,in_RDX);
    }
  }
  else {
    local_8 = (btBroadphasePair *)0x0;
  }
  return local_8;
}

Assistant:

btBroadphasePair*	btSortedOverlappingPairCache::addOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
{
	//don't add overlap with own
	btAssert(proxy0 != proxy1);

	if (!needsBroadphaseCollision(proxy0,proxy1))
		return 0;
	
	void* mem = &m_overlappingPairArray.expandNonInitializing();
	btBroadphasePair* pair = new (mem) btBroadphasePair(*proxy0,*proxy1);
	
	gOverlappingPairs++;
	gAddedPairs++;
	
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0, proxy1);
	return pair;
	
}